

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                    (ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex,ma_uint64 byteRangeLo,
                    ma_uint64 byteRangeHi)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ulong uVar3;
  long lVar4;
  ma_uint64 mVar5;
  ma_uint64 mVar6;
  float fVar7;
  ma_uint64 lastSuccessfulSeekOffset;
  ulong local_48;
  ma_uint64 local_40;
  ulong local_38;
  
  mVar5 = pFlac->totalPCMFrameCount;
  local_40 = 0xffffffffffffffff;
  uVar1 = pFlac->maxBlockSizeInPCMFrames;
  local_38 = 0x1000;
  if (uVar1 != 0) {
    local_38 = (ulong)((uint)uVar1 + (uint)uVar1);
  }
  fVar7 = (float)(long)((ulong)pFlac->bitsPerSample * (ulong)pFlac->channels *
                       (pcmFrameIndex - pFlac->currentPCMFrame)) * 0.125 * 0.6;
  uVar3 = (ulong)fVar7;
  uVar3 = ((long)(fVar7 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) + byteRangeLo;
  if (byteRangeHi <= uVar3) {
    uVar3 = byteRangeHi;
  }
  mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                    (pFlac,uVar3,byteRangeLo,byteRangeHi,&local_40);
  local_48 = byteRangeLo;
  do {
    if (mVar2 == 0) {
LAB_0016f0a1:
      ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
      memset(&pFlac->currentFLACFrame,0,0xa8);
      return 0;
    }
    mVar6 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (mVar6 == 0) {
      mVar6 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    if (mVar5 == mVar6) {
      mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                        (pFlac,local_48,local_48,byteRangeHi,&local_40);
      if (mVar2 != 0) {
LAB_0016f085:
        mVar6 = pcmFrameIndex - pFlac->currentPCMFrame;
        mVar5 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar6);
        if (mVar5 == mVar6) {
          return 1;
        }
      }
      goto LAB_0016f0a1;
    }
    lVar4 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar6;
    uVar3 = lVar4 - 1;
    if (lVar4 == 0) {
      uVar3 = 0;
    }
    if ((mVar6 <= pcmFrameIndex) && (pcmFrameIndex <= uVar3)) goto LAB_0016f085;
    lVar4 = (ulong)pFlac->bitsPerSample * (ulong)pFlac->channels;
    if (pcmFrameIndex < mVar6) {
      if (local_40 <= byteRangeLo) {
        byteRangeLo = local_40;
      }
      uVar3 = (local_40 - byteRangeLo >> 1) + byteRangeLo;
      byteRangeHi = local_40;
      if (uVar3 <= byteRangeLo) {
        uVar3 = byteRangeLo;
      }
    }
    else {
      if (pcmFrameIndex - mVar6 < local_38) goto LAB_0016f085;
      if (byteRangeHi <= local_40) {
        byteRangeHi = local_40;
      }
      fVar7 = (float)(long)(lVar4 * (pcmFrameIndex - mVar6)) * 0.125 *
              ((float)(long)(local_40 - pFlac->firstFLACFramePosInBytes) /
              ((float)(long)(lVar4 * mVar6) * 0.125));
      uVar3 = (ulong)fVar7;
      uVar3 = ((long)(fVar7 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3) + local_40;
      if (byteRangeHi <= uVar3) {
        uVar3 = byteRangeHi;
      }
      byteRangeLo = local_40;
      if (local_48 <= local_40) {
        local_48 = local_40;
      }
    }
    mVar2 = ma_dr_flac__seek_to_approximate_flac_frame_to_byte
                      (pFlac,uVar3,byteRangeLo,byteRangeHi,&local_40);
    mVar5 = mVar6;
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__binary_search_internal(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex, ma_uint64 byteRangeLo, ma_uint64 byteRangeHi)
{
    ma_uint64 targetByte;
    ma_uint64 pcmRangeLo = pFlac->totalPCMFrameCount;
    ma_uint64 pcmRangeHi = 0;
    ma_uint64 lastSuccessfulSeekOffset = (ma_uint64)-1;
    ma_uint64 closestSeekOffsetBeforeTargetPCMFrame = byteRangeLo;
    ma_uint32 seekForwardThreshold = (pFlac->maxBlockSizeInPCMFrames != 0) ? pFlac->maxBlockSizeInPCMFrames*2 : 4096;
    targetByte = byteRangeLo + (ma_uint64)(((ma_int64)((pcmFrameIndex - pFlac->currentPCMFrame) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * MA_DR_FLAC_BINARY_SEARCH_APPROX_COMPRESSION_RATIO);
    if (targetByte > byteRangeHi) {
        targetByte = byteRangeHi;
    }
    for (;;) {
        if (ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, targetByte, byteRangeLo, byteRangeHi, &lastSuccessfulSeekOffset)) {
            ma_uint64 newPCMRangeLo;
            ma_uint64 newPCMRangeHi;
            ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &newPCMRangeLo, &newPCMRangeHi);
            if (pcmRangeLo == newPCMRangeLo) {
                if (!ma_dr_flac__seek_to_approximate_flac_frame_to_byte(pFlac, closestSeekOffsetBeforeTargetPCMFrame, closestSeekOffsetBeforeTargetPCMFrame, byteRangeHi, &lastSuccessfulSeekOffset)) {
                    break;
                }
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                    return MA_TRUE;
                } else {
                    break;
                }
            }
            pcmRangeLo = newPCMRangeLo;
            pcmRangeHi = newPCMRangeHi;
            if (pcmRangeLo <= pcmFrameIndex && pcmRangeHi >= pcmFrameIndex) {
                if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame) ) {
                    return MA_TRUE;
                } else {
                    break;
                }
            } else {
                const float approxCompressionRatio = (ma_int64)(lastSuccessfulSeekOffset - pFlac->firstFLACFramePosInBytes) / ((ma_int64)(pcmRangeLo * pFlac->channels * pFlac->bitsPerSample)/8.0f);
                if (pcmRangeLo > pcmFrameIndex) {
                    byteRangeHi = lastSuccessfulSeekOffset;
                    if (byteRangeLo > byteRangeHi) {
                        byteRangeLo = byteRangeHi;
                    }
                    targetByte = byteRangeLo + ((byteRangeHi - byteRangeLo) / 2);
                    if (targetByte < byteRangeLo) {
                        targetByte = byteRangeLo;
                    }
                } else  {
                    if ((pcmFrameIndex - pcmRangeLo) < seekForwardThreshold) {
                        if (ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(pFlac, pcmFrameIndex - pFlac->currentPCMFrame)) {
                            return MA_TRUE;
                        } else {
                            break;
                        }
                    } else {
                        byteRangeLo = lastSuccessfulSeekOffset;
                        if (byteRangeHi < byteRangeLo) {
                            byteRangeHi = byteRangeLo;
                        }
                        targetByte = lastSuccessfulSeekOffset + (ma_uint64)(((ma_int64)((pcmFrameIndex-pcmRangeLo) * pFlac->channels * pFlac->bitsPerSample)/8.0f) * approxCompressionRatio);
                        if (targetByte > byteRangeHi) {
                            targetByte = byteRangeHi;
                        }
                        if (closestSeekOffsetBeforeTargetPCMFrame < lastSuccessfulSeekOffset) {
                            closestSeekOffsetBeforeTargetPCMFrame = lastSuccessfulSeekOffset;
                        }
                    }
                }
            }
        } else {
            break;
        }
    }
    ma_dr_flac__seek_to_first_frame(pFlac);
    return MA_FALSE;
}